

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O1

string * __thiscall
testing::internal::StreamableToString<char*>
          (string *__return_storage_ptr__,internal *this,char **streamable)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  long in_FS_OFFSET;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&local_30);
  __s = *(char **)this;
  poVar3 = (ostream *)(local_30.ptr_ + 0x10);
  if (__s == (char *)0x0) {
    sVar2 = 6;
    __s = "(null)";
  }
  else {
    sVar2 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  sVar1.ptr_ = local_30.ptr_;
  StringStreamToString(__return_storage_ptr__,local_30.ptr_);
  if (sVar1.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)sVar1.ptr_ + 8))(sVar1.ptr_);
    local_30.ptr_ = (stringstream *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}